

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_assassinate(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  CClass *this;
  CHAR_DATA *pCVar7;
  char *pcVar8;
  char *pcVar9;
  CHAR_DATA *in_RDI;
  char buf [4608];
  char arg [4608];
  int dam;
  int chance;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffdba8;
  undefined4 in_stack_ffffffffffffdbb0;
  undefined4 in_stack_ffffffffffffdbb4;
  int in_stack_ffffffffffffdbb8;
  int in_stack_ffffffffffffdbbc;
  char_data *in_stack_ffffffffffffdbc0;
  CHAR_DATA *ch_00;
  int in_stack_ffffffffffffdbd0;
  CHAR_DATA *in_stack_ffffffffffffdbd8;
  CHAR_DATA *in_stack_ffffffffffffdbe0;
  int in_stack_ffffffffffffdc84;
  undefined1 in_stack_ffffffffffffdc8b;
  int in_stack_ffffffffffffdc8c;
  CHAR_DATA *in_stack_ffffffffffffdc90;
  int in_stack_ffffffffffffdcac;
  CHAR_DATA *in_stack_ffffffffffffdcb0;
  int in_stack_ffffffffffffddd4;
  CHAR_DATA *in_stack_ffffffffffffddd8;
  CHAR_DATA *in_stack_ffffffffffffdde0;
  char *in_stack_ffffffffffffedb0;
  CHAR_DATA *in_stack_ffffffffffffedb8;
  char local_1228;
  int local_1c;
  
  one_argument((char *)CONCAT44(in_stack_ffffffffffffdbb4,in_stack_ffffffffffffdbb0),
               (char *)in_stack_ffffffffffffdba8);
  bVar1 = is_npc(in_stack_ffffffffffffdba8);
  if (!bVar1) {
    iVar2 = get_skill(in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdcac);
    if (iVar2 != 0) {
      iVar2 = (int)in_RDI->level;
      ch_00 = (CHAR_DATA *)(skill_table + gsn_assassinate);
      this = char_data::Class(in_stack_ffffffffffffdbc0);
      iVar3 = CClass::GetIndex(this);
      if (*(short *)((long)&ch_00->next_in_room + (long)iVar3 * 2) <= iVar2) {
        if (local_1228 == '\0') {
          send_to_char((char *)in_stack_ffffffffffffdbc0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
          return;
        }
        pCVar7 = get_char_room(in_stack_ffffffffffffedb8,in_stack_ffffffffffffedb0);
        if (pCVar7 == (CHAR_DATA *)0x0) {
          send_to_char((char *)in_stack_ffffffffffffdbc0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
          return;
        }
        if (pCVar7 == in_RDI) {
          send_to_char((char *)in_stack_ffffffffffffdbc0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
          return;
        }
        if ((pCVar7->fighting != (CHAR_DATA *)0x0) || (pCVar7->position == 7)) {
          send_to_char((char *)in_stack_ffffffffffffdbc0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
          return;
        }
        bVar1 = is_safe((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbb4,in_stack_ffffffffffffdbb0),
                        in_stack_ffffffffffffdba8);
        if (bVar1) {
          return;
        }
        bVar1 = check_blade_barrier((CHAR_DATA *)
                                    CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),
                                    (CHAR_DATA *)
                                    CONCAT44(in_stack_ffffffffffffdbb4,in_stack_ffffffffffffdbb0));
        if (bVar1) {
          return;
        }
        if (pCVar7->hit < pCVar7->max_hit + -0x32) {
          send_to_char((char *)in_stack_ffffffffffffdbc0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
          return;
        }
        iVar3 = get_skill(in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdcac);
        iVar4 = number_percent();
        if (iVar3 < iVar4) {
          pCVar7 = (CHAR_DATA *)&stack0xffffffffffffdbd8;
          pcVar8 = pers((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),
                        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbb4,in_stack_ffffffffffffdbb0));
          sprintf((char *)pCVar7,"Help! %s just tried to assassinate me!",pcVar8);
          do_myell(pCVar7,(char *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbb4,in_stack_ffffffffffffdbb0));
          damage_old(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8,iVar2,
                     in_stack_ffffffffffffdbd0,(int)((ulong)ch_00 >> 0x20),
                     SUB81((ulong)ch_00 >> 0x18,0));
          check_improve(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,
                        (bool)in_stack_ffffffffffffdc8b,in_stack_ffffffffffffdc84);
          WAIT_STATE(pCVar7,in_stack_ffffffffffffdbbc);
          return;
        }
        local_1c = in_RDI->level * 3 + (iVar3 << 1) / 3 + pCVar7->level * -4;
        bVar1 = can_see(ch_00,in_stack_ffffffffffffdbc0);
        if (!bVar1) {
          local_1c = local_1c + 10;
        }
        if (pCVar7->position == 7) {
          local_1c = local_1c + -10;
        }
        else if (pCVar7->position == 4) {
          local_1c = local_1c + 10;
        }
        iVar3 = local_1c / 2;
        if (iVar3 < 2) {
          iVar3 = in_stack_ffffffffffffdbb8;
          iVar4 = 2;
        }
        else {
          iVar4 = iVar3;
          if (0x19 < iVar3) {
            iVar3 = 0x19;
            iVar4 = iVar3;
          }
        }
        local_1c = iVar4;
        if (in_RDI->level + 8 < (int)pCVar7->level) {
          local_1c = 0;
        }
        if (6 < local_1c) {
          local_1c = 5;
        }
        act((char *)in_stack_ffffffffffffdbc0,(CHAR_DATA *)CONCAT44(iVar4,iVar3),
            (void *)CONCAT44(in_stack_ffffffffffffdbb4,in_stack_ffffffffffffdbb0),
            in_stack_ffffffffffffdba8,0);
        act((char *)in_stack_ffffffffffffdbc0,(CHAR_DATA *)CONCAT44(iVar4,iVar3),
            (void *)CONCAT44(in_stack_ffffffffffffdbb4,in_stack_ffffffffffffdbb0),
            in_stack_ffffffffffffdba8,0);
        if (in_RDI->level == 0x3c) {
          local_1c = 100;
        }
        iVar5 = number_percent();
        if (iVar5 < local_1c) {
          act((char *)in_stack_ffffffffffffdbc0,(CHAR_DATA *)CONCAT44(iVar4,iVar3),
              (void *)CONCAT44(in_stack_ffffffffffffdbb4,in_stack_ffffffffffffdbb0),
              in_stack_ffffffffffffdba8,0);
          act((char *)in_stack_ffffffffffffdbc0,(CHAR_DATA *)CONCAT44(iVar4,iVar3),
              (void *)CONCAT44(in_stack_ffffffffffffdbb4,in_stack_ffffffffffffdbb0),
              in_stack_ffffffffffffdba8,0);
          act_new((char *)buf._208_8_,(CHAR_DATA *)buf._200_8_,(void *)buf._192_8_,
                  (void *)buf._184_8_,buf._180_4_,buf._176_4_);
          raw_kill((CHAR_DATA *)arg._352_8_,(CHAR_DATA *)arg._344_8_);
          check_improve(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,
                        (bool)in_stack_ffffffffffffdc8b,in_stack_ffffffffffffdc84);
          return;
        }
        iVar5 = number_percent();
        iVar6 = get_skill(in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdcac);
        if (iVar5 < iVar6) {
          number_percent();
        }
        damage_old(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8,iVar2,
                   in_stack_ffffffffffffdbd0,(int)((ulong)ch_00 >> 0x20),
                   SUB81((ulong)ch_00 >> 0x18,0));
        check_improve(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,
                      (bool)in_stack_ffffffffffffdc8b,in_stack_ffffffffffffdc84);
        bVar1 = is_npc(in_stack_ffffffffffffdba8);
        if (((!bVar1) && (bVar1 = is_npc(in_stack_ffffffffffffdba8), !bVar1)) &&
           (pCVar7->ghost == 0)) {
          pcVar8 = &stack0xffffffffffffdbd8;
          pcVar9 = pers((CHAR_DATA *)CONCAT44(iVar4,iVar3),
                        (CHAR_DATA *)CONCAT44(iVar5,in_stack_ffffffffffffdbb0));
          sprintf(pcVar8,"Help! %s just tried to assassinate me!",pcVar9);
          do_myell(in_stack_ffffffffffffdbc0,(char *)CONCAT44(iVar4,iVar3),
                   (CHAR_DATA *)CONCAT44(iVar5,in_stack_ffffffffffffdbb0));
        }
        multi_hit(in_stack_ffffffffffffdde0,in_stack_ffffffffffffddd8,in_stack_ffffffffffffddd4);
        WAIT_STATE(in_stack_ffffffffffffdbc0,iVar4);
        return;
      }
    }
    send_to_char((char *)in_stack_ffffffffffffdbc0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
  }
  return;
}

Assistant:

void do_assassinate(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	int chance, dam;
	char arg[MAX_INPUT_LENGTH];
	char buf[MAX_INPUT_LENGTH];

	one_argument(argument, arg);

	if (is_npc(ch))
		return;

	if (get_skill(ch, gsn_assassinate) == 0 ||
		ch->level < skill_table[gsn_assassinate].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		send_to_char("Attempt to assassinate who?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("You can't do that.\n\r", ch);
		return;
	}

	if (victim->fighting != nullptr || victim->position == POS_FIGHTING)
	{
		send_to_char("They are moving around too much to get in close for the kill.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (check_blade_barrier(ch, victim))
		return;

	if (victim->hit < victim->max_hit - 50)
	{
		send_to_char("They have too much blood on them right now to locate their strike point.\n\r", ch);
		return;
	}

	chance = get_skill(ch, gsn_assassinate);

	if (number_percent() > chance)
	{
		sprintf(buf, "Help! %s just tried to assassinate me!", pers(ch, victim));
		do_myell(victim, buf, ch);
		damage_old(ch, victim, 0, gsn_assassinate, DAM_OTHER, true);
		check_improve(ch, gsn_assassinate, 1, true);
		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		return;
	}

	chance *= 2;
	chance /= 3;
	chance += (ch->level * 3);
	chance -= (victim->level * 4);

	if (!can_see(victim, ch))
		chance += 10;

	if (victim->position == POS_FIGHTING)
		chance -= 10;
	else if (victim->position == POS_SLEEPING)
		chance += 10;

	chance /= 2;
	chance = URANGE(2, chance, 25);

	if (victim->level > (ch->level + 8))
		chance = 0;

	if (chance > 6)
		chance = 5;

	act("$n tries to strike at $N's critical nerves!", ch, 0, victim, TO_NOTVICT);
	act("You try to strike $N's critical nerves!", ch, 0, victim, TO_CHAR);

	/*        act("$n strikes at your critical nerves!",ch,0,victim,TO_VICT); */

	if (ch->level == MAX_LEVEL)
	{
		chance = 100;
	}

	if (number_percent() < chance)
	{
		act("$n +++ ASSASSINATES +++ $N!", ch, 0, victim, TO_NOTVICT);
		act("You +++ ASSASSINATE +++ $N!", ch, 0, victim, TO_CHAR);
		act_new("$n +++ ASSASSINATES +++ you!", ch, 0, victim, TO_VICT, POS_DEAD);
		raw_kill(ch, victim);
		check_improve(ch, gsn_assassinate, true, 3);
		return;
	}
	else
	{
		dam = ch->damroll * 2;

		if (number_percent() < get_skill(ch, gsn_enhanced_damage))
		{
			dam += (number_percent() * dam / 100);
		}

		damage_old(ch, victim, dam, gsn_assassinate, DAM_ENERGY, true);
		check_improve(ch, gsn_assassinate, false, 1);

		if (!is_npc(victim) && !is_npc(ch) && (victim->ghost == 0))
		{
			sprintf(buf, "Help! %s just tried to assassinate me!", pers(ch, victim));
			do_myell(victim, buf, ch);
		}

		multi_hit(victim, ch, TYPE_UNDEFINED);
		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
	}
}